

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationData::getLastPrimaryForGroup(CollationData *this,int32_t script)

{
  uint32_t uVar1;
  ushort uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  if (script < 0) {
LAB_00230a42:
    uVar2 = 0;
  }
  else {
    if (script < this->numScripts) {
      uVar3 = (ulong)(uint)script;
    }
    else {
      if ((script & 0x7ffffff8U) != 0x1000) goto LAB_00230a42;
      uVar3 = (ulong)(this->numScripts + script + -0x1000);
    }
    uVar2 = this->scriptsIndex[uVar3];
  }
  if (uVar2 != 0) {
    uVar1 = (uint)this->scriptStarts[(ulong)uVar2 + 1] * 0x10000 - 1;
  }
  return uVar1;
}

Assistant:

uint32_t
CollationData::getLastPrimaryForGroup(int32_t script) const {
    int32_t index = getScriptIndex(script);
    if(index == 0) {
        return 0;
    }
    uint32_t limit = scriptStarts[index + 1];
    return (limit << 16) - 1;
}